

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O1

void __thiscall imrt::Collimator::printCoordinates(Collimator *this)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  ulong uVar3;
  _Self __tmp;
  
  for (p_Var2 = (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->beam_coord)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (p_Var2[1]._M_left != p_Var2[1]._M_parent) {
      uVar3 = 0;
      do {
        poVar1 = std::ostream::_M_insert<double>(*(double *)(p_Var2 + 1));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," : ",3);
        poVar1 = std::ostream::_M_insert<double>
                           (*(double *)(&(p_Var2[1]._M_parent)->_M_color + uVar3 * 2));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)p_Var2[1]._M_left - (long)p_Var2[1]._M_parent >> 3));
    }
  }
  return;
}

Assistant:

void Collimator::printCoordinates() {
    for (map<double, vector<double> >::iterator it = beam_coord.begin() ; it != beam_coord.end() ; it ++ ) {
      for (int i=0; i < it->second.size(); i++) {
        cout << it->first << " : " << it->second[i] << endl;
      }
    }
  }